

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O1

ostream * std::operator<<(ostream *os,
                         vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                         *v)

{
  ulong uVar1;
  pointer ppVar2;
  long lVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
  ppVar2 = (v->
           super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((v->super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>).
      _M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    lVar3 = 0;
    uVar1 = 0;
    do {
      operator<<(os,(point3d *)((long)&ppVar2->x + lVar3));
      if (uVar1 != ((long)(v->
                          super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(v->
                          super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
                   1U) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      }
      uVar1 = uVar1 + 1;
      ppVar2 = (v->
               super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x18;
    } while (uVar1 < (ulong)(((long)(v->
                                    super__Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2 >> 3)
                            * -0x5555555555555555));
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const std::vector<T> &v) {
  os << "[";
  for (size_t i = 0; i < v.size(); i++) {
    os << v[i];
    if (i != (v.size() - 1)) {
      os << ", ";
    }
  }
  os << "]";
  return os;
}